

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildArg(IRBuilder *this,OpCode newOpcode,uint32 offset,ArgSlot argument,
                   RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *sym;
  SymOpnd *dstOpnd_00;
  RegOpnd *src1Opnd_00;
  RegOpnd *src1Opnd;
  SymOpnd *dstOpnd;
  StackSym *symDst;
  Instr *pIStack_28;
  IRType type;
  Instr *instr;
  RegSlot srcRegSlot_local;
  ArgSlot argument_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  instr._0_4_ = srcRegSlot;
  instr._6_2_ = argument;
  srcRegSlot_local = offset;
  argument_local = newOpcode;
  _offset_local = this;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17ba,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  symDst._7_1_ = TyVar;
  if (argument_local == 0x5b) {
    argument_local = 0x59;
    symDst._7_1_ = TyUint64;
  }
  this->m_argsOnStack = this->m_argsOnStack + 1;
  if (instr._6_2_ == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17c6,"(argument < 0xffff)","argument < USHRT_MAX");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  sym = SymTable::GetArgSlotSym(this->m_func->m_symTable,instr._6_2_ + 1);
  if ((sym != (StackSym *)0x0) && ((uint)(ushort)(instr._6_2_ + 1) == instr._6_2_ + 1)) {
    dstOpnd_00 = IR::SymOpnd::New(&sym->super_Sym,symDst._7_1_,this->m_func);
    src1Opnd_00 = BuildSrcOpnd(this,(RegSlot)instr,symDst._7_1_);
    pIStack_28 = IR::Instr::New(argument_local,&dstOpnd_00->super_Opnd,&src1Opnd_00->super_Opnd,
                                this->m_func);
    AddInstr(this,pIStack_28,srcRegSlot_local);
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Push
              (this->m_argStack,&stack0xffffffffffffffd8);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x17ca,"((0))","Arg count too big...");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void
IRBuilder::BuildArg(Js::OpCode newOpcode, uint32 offset, Js::ArgSlot argument, Js::RegSlot srcRegSlot)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr *     instr;
    IRType type = TyVar;
    if (newOpcode == Js::OpCode::ArgOut_ANonVar)
    {
        newOpcode = Js::OpCode::ArgOut_A;
        type = TyMachPtr;
    }
    m_argsOnStack++;
    StackSym *      symDst;

    Assert(argument < USHRT_MAX);
    symDst = m_func->m_symTable->GetArgSlotSym((uint16)(argument+1));
    if (symDst == nullptr || (uint16)(argument + 1) != (argument + 1))
    {
        AssertMsg(UNREACHED, "Arg count too big...");
        Fatal();
    }

    IR::SymOpnd * dstOpnd = IR::SymOpnd::New(symDst, type, m_func);
    IR::RegOpnd *  src1Opnd = this->BuildSrcOpnd(srcRegSlot, type);
    instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);

    this->AddInstr(instr, offset);

    m_argStack->Push(instr);
}